

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

MutableSubtree ts_subtree_make_mut(SubtreePool *pool,Subtree self)

{
  SubtreeHeapData *pSVar1;
  Subtree *pSVar2;
  anon_union_24_2_84168a9f_for_ExternalScannerState_0 local_50;
  undefined8 local_38;
  uint local_2c;
  SubtreeHeapData *pSStack_28;
  uint32_t i;
  SubtreeHeapData *result;
  SubtreePool *pool_local;
  Subtree self_local;
  
  self_local = self;
  if (((ulong)self.ptr & 1) == 0) {
    result = (SubtreeHeapData *)pool;
    pool_local = (SubtreePool *)self;
    if ((self.ptr)->ref_count == 1) {
      self_local = (Subtree)ts_subtree_to_mut_unsafe(self);
    }
    else {
      pSStack_28 = ts_subtree_pool_allocate(pool);
      memcpy(pSStack_28,pool_local,0x58);
      pSVar1 = pSStack_28;
      if (pSStack_28->child_count == 0) {
        if ((*(ushort *)&pSStack_28->field_0x2c >> 6 & 1) != 0) {
          ts_external_scanner_state_copy
                    ((ExternalScannerState *)&local_50,
                     (ExternalScannerState *)&pool_local[1].tree_stack);
          (pSVar1->field_17).field_0.children = (Subtree *)local_50.long_data;
          *(undefined8 *)((long)&pSVar1->field_17 + 8) = local_50._8_8_;
          *(undefined8 *)((long)&pSVar1->field_17 + 0x10) = local_50._16_8_;
          *(undefined8 *)((long)&pSVar1->field_17 + 0x18) = local_38;
        }
      }
      else {
        pSVar2 = (Subtree *)
                 ts_calloc((ulong)*(uint *)((long)&pool_local[1].free_trees.contents + 4),8);
        (pSStack_28->field_17).field_0.children = pSVar2;
        memcpy((pSStack_28->field_17).field_0.children,pool_local[1].tree_stack.contents,
               (ulong)pSStack_28->child_count << 3);
        for (local_2c = 0; local_2c < pSStack_28->child_count; local_2c = local_2c + 1) {
          ts_subtree_retain((pSStack_28->field_17).field_0.children[local_2c]);
        }
      }
      pSStack_28->ref_count = 1;
      ts_subtree_release((SubtreePool *)result,(Subtree)pool_local);
      self_local.ptr = pSStack_28;
    }
  }
  return (MutableSubtree)self_local.data;
}

Assistant:

MutableSubtree ts_subtree_make_mut(SubtreePool *pool, Subtree self) {
  if (self.data.is_inline) return (MutableSubtree) {self.data};
  if (self.ptr->ref_count == 1) return ts_subtree_to_mut_unsafe(self);

  SubtreeHeapData *result = ts_subtree_pool_allocate(pool);
  memcpy(result, self.ptr, sizeof(SubtreeHeapData));
  if (result->child_count > 0) {
    result->children = ts_calloc(self.ptr->child_count, sizeof(Subtree));
    memcpy(result->children, self.ptr->children, result->child_count * sizeof(Subtree));
    for (uint32_t i = 0; i < result->child_count; i++) {
      ts_subtree_retain(result->children[i]);
    }
  } else if (result->has_external_tokens) {
    result->external_scanner_state = ts_external_scanner_state_copy(&self.ptr->external_scanner_state);
  }
  result->ref_count = 1;
  ts_subtree_release(pool, self);
  return (MutableSubtree) {.ptr = result};
}